

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.h
# Opt level: O0

uchar AR_EQ(uint *a,uint *b,uint size)

{
  uint local_28;
  uint i;
  uint size_local;
  uint *b_local;
  uint *a_local;
  
  local_28 = 0;
  while( true ) {
    if (size <= local_28) {
      return '\x01';
    }
    if (a[local_28] != b[local_28]) break;
    local_28 = local_28 + 1;
  }
  return '\0';
}

Assistant:

uint8_t AR_EQ(uint32_t *a, uint32_t *b, uint32_t size)
{
    for (uint32_t i = 0; i < size; i++)
        if (a[i] != b[i])
            return 0;
    return 1;
}